

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O3

void __thiscall
pcplusplus::threads::producer_threads::producer_threads
          (producer_threads *this,size_t target,size_t count,mutex *mtx,C_V *canPro,C_V *canCon,
          queue<long> *buff)

{
  time_t __seedval;
  
  generic_threads::generic_threads(&this->super_generic_threads,target,count,mtx,canPro,canCon,buff)
  ;
  (this->super_generic_threads)._vptr_generic_threads = (_func_int **)&PTR_thread_routine_00108c48;
  (this->thread_type)._M_dataplus._M_p = (pointer)&(this->thread_type).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->thread_type,"producer","");
  std::ofstream::open((char *)&(this->super_generic_threads).logfile,0x1060e1);
  __seedval = time((time_t *)0x0);
  srand48(__seedval);
  return;
}

Assistant:

producer_threads::producer_threads(size_t target, size_t count, std::mutex *mtx, C_V *canPro, C_V *canCon, queue<long> *buff)
	: generic_threads(target, count, mtx, canPro, canCon, buff)
    {
	try{
	    logfile.open(PRODUCER_LOG_FILENAME, std::fstream::out | std::fstream::trunc);
	}
	catch(const std::ofstream::failure& e){
	    std::cerr << PRODUCER_LOG_FILENAME " could not be opened for writing" << std::endl;
	}
	srand48(std::time(nullptr));
    }